

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O2

void __thiscall Configuration::Configuration(Configuration *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Configuration = (_func_int **)&PTR__Configuration_0014d360;
  p_Var1 = &(this->stringConfiguration)._M_t._M_impl.super__Rb_tree_header;
  (this->stringConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stringConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->stringConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->stringConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->stringConfiguration)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->integerConfiguration)._M_t._M_impl.super__Rb_tree_header;
  (this->integerConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->integerConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->integerConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->integerConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->integerConfiguration)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->booleanConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->booleanConfiguration)._M_t._M_impl.super__Rb_tree_header;
  (this->booleanConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->booleanConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->booleanConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->booleanConfiguration)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->configLoader = (ConfigLoader *)0x0;
  return;
}

Assistant:

Configuration::Configuration()
{
	configLoader = NULL;
}